

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O1

void Lf_ManAnalyzeCoDrivers(Gia_Man_t *p,int *pnDrivers,int *pnInverts)

{
  uint *puVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  void *__s;
  char *__function;
  long lVar7;
  int iVar8;
  uint uVar9;
  char *__file;
  char *__assertion;
  int iVar10;
  
  iVar2 = p->nObjs;
  iVar8 = 0x10;
  if (0xe < iVar2 - 1U) {
    iVar8 = iVar2;
  }
  if (iVar8 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar8 << 2);
  }
  iVar8 = 0;
  memset(__s,0,(long)iVar2 * 4);
  pVVar5 = p->vCos;
  if (0 < pVVar5->nSize) {
    piVar6 = pVVar5->pArray;
    lVar7 = 0;
    do {
      iVar10 = piVar6[lVar7];
      if (((long)iVar10 < 0) || (p->nObjs <= iVar10)) {
        __assertion = "v >= 0 && v < p->nObjs";
        __file = 
        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
        ;
        __function = "Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)";
LAB_0070a085:
        __assert_fail(__assertion,__file,0x1af,__function);
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar3 = *(uint *)(p->pObjs + iVar10);
      uVar9 = iVar10 - (uVar3 & 0x1fffffff);
      if (((int)uVar9 < 0) || (iVar2 <= (int)uVar9)) {
        __assertion = "i >= 0 && i < p->nSize";
        __file = 
        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
        ;
        __function = "int *Vec_IntEntryP(Vec_Int_t *, int)";
        goto LAB_0070a085;
      }
      puVar1 = (uint *)((long)__s + (ulong)uVar9 * 4);
      *puVar1 = *puVar1 | ((uVar3 >> 0x1d & 1) != 0) + 1;
      lVar7 = lVar7 + 1;
    } while (lVar7 < pVVar5->nSize);
  }
  iVar10 = 0;
  if (0 < iVar2) {
    lVar7 = 0;
    iVar10 = 0;
    iVar8 = 0;
    do {
      iVar4 = *(int *)((long)__s + lVar7 * 4);
      iVar8 = (iVar8 + 1) - (uint)(iVar4 == 0);
      iVar10 = iVar10 + (uint)(iVar4 == 3);
      lVar7 = lVar7 + 1;
    } while (iVar2 != lVar7);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  *pnDrivers = iVar8;
  *pnInverts = iVar10;
  return;
}

Assistant:

void Lf_ManAnalyzeCoDrivers( Gia_Man_t * p, int * pnDrivers, int * pnInverts )
{
    Gia_Obj_t * pObj;
    int i, Entry, nDrivers, nInverts;
    Vec_Int_t * vMarks = Vec_IntStart( Gia_ManObjNum(p) );
    nDrivers = nInverts = 0;
    Gia_ManForEachCo( p, pObj, i )
        *Vec_IntEntryP( vMarks, Gia_ObjFaninId0p(p, pObj) ) |= Gia_ObjFaninC0(pObj) ? 2 : 1;
    Vec_IntForEachEntry( vMarks, Entry, i )
        nDrivers += (int)(Entry != 0), nInverts += (int)(Entry == 3);
    Vec_IntFree( vMarks );
    *pnDrivers = nDrivers;
    *pnInverts = nInverts;
}